

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.h
# Opt level: O0

cmCommand * __thiscall cmFileCommand::Clone(cmFileCommand *this)

{
  cmCommand *this_00;
  cmFileCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmFileCommand((cmFileCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmFileCommand;
    }